

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lang_model.cpp
# Opt level: O1

TCount NJamSpell::GetGramHashCount<unsigned_int>
                 (uint key,TPerfectHash *ph,
                 vector<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
                 *buckets)

{
  uint16_t uVar1;
  pointer ppVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  TCount TVar6;
  int iVar7;
  double dVar8;
  uint local_2c [2];
  uint key_local;
  
  local_2c[0] = key;
  if (GetGramHashCount<unsigned_int>(unsigned_int,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
      ::tmpBuffStream == '\0') {
    GetGramHashCount<unsigned_int>();
  }
  if (GetGramHashCount<unsigned_int>(unsigned_int,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
      ::out == '\0') {
    iVar7 = __cxa_guard_acquire(&GetGramHashCount<unsigned_int>(unsigned_int,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                                 ::out);
    if (iVar7 != 0) {
      std::ostream::ostream
                (GetGramHashCount<unsigned_int>(unsigned_int,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                 ::out,(streambuf *)&GetGramHashCount<unsigned_int>::tmpBuffStream);
      __cxa_atexit(std::ostream::~ostream,
                   GetGramHashCount<unsigned_int>(unsigned_int,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                   ::out,&__dso_handle);
      __cxa_guard_release(&GetGramHashCount<unsigned_int>(unsigned_int,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                           ::out);
    }
  }
  GetGramHashCount<unsigned_int>::tmpBuffStream.Pos = 0;
  std::ostream::write(GetGramHashCount<unsigned_int>(unsigned_int,NJamSpell::TPerfectHash_const&,std::vector<std::pair<unsigned_short,unsigned_short>,std::allocator<std::pair<unsigned_short,unsigned_short>>>const&)
                      ::out,(long)local_2c);
  uVar4 = TPerfectHash::Hash(ph,GetGramHashCount<unsigned_int>::tmpBuff,
                             GetGramHashCount<unsigned_int>::tmpBuffStream.Pos);
  uVar5 = TPerfectHash::BucketsNumber(ph);
  if (uVar4 < uVar5) {
    ppVar2 = (buckets->
             super__Vector_base<std::pair<unsigned_short,_unsigned_short>,_std::allocator<std::pair<unsigned_short,_unsigned_short>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    uVar1 = ppVar2[uVar4].first;
    uVar3 = CityHash16(GetGramHashCount<unsigned_int>::tmpBuff,
                       GetGramHashCount<unsigned_int>::tmpBuffStream.Pos);
    TVar6 = 0;
    if (uVar1 == uVar3) {
      dVar8 = pow((double)ppVar2[uVar4].second * 1.52587890625e-05,5.0);
      dVar8 = ceil(dVar8 * 268435456.0);
      TVar6 = (TCount)(long)dVar8;
    }
    return TVar6;
  }
  __assert_fail("bucket < ph.BucketsNumber()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/imShayan[P]JamSpell/jamspell/lang_model.cpp"
                ,0x18b,
                "TCount NJamSpell::GetGramHashCount(T, const TPerfectHash &, const std::vector<std::pair<uint16_t, uint16_t>> &) [T = unsigned int]"
               );
}

Assistant:

TCount GetGramHashCount(T key,
                        const TPerfectHash& ph,
                        const std::vector<std::pair<uint16_t, uint16_t>>& buckets)
{
    constexpr int TMP_BUF_SIZE = 128;
    static char tmpBuff[TMP_BUF_SIZE];
    static MemStream tmpBuffStream(tmpBuff, TMP_BUF_SIZE - 1);
    static std::ostream out(&tmpBuffStream);

    tmpBuffStream.Reset();

    NHandyPack::Dump(out, key);

    uint32_t bucket = ph.Hash(tmpBuff, tmpBuffStream.Size());

    assert(bucket < ph.BucketsNumber());
    const std::pair<uint16_t, uint16_t>& data = buckets[bucket];

    TCount res = TCount();
    if (data.first == CityHash16(tmpBuff, tmpBuffStream.Size())) {
        res = UnpackInt32(data.second);
    }
    return res;
}